

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

RangeValue __thiscall CoreML::RangeValue::operator+(RangeValue *this,RangeValue *other)

{
  undefined7 extraout_var;
  size_t sVar1;
  undefined8 extraout_RAX;
  undefined7 uVar2;
  RangeValue RVar3;
  RangeValue local_30;
  RangeValue local_20;
  
  if (other->_isUnbound == true) {
    RangeValue(&local_30);
    uVar2 = extraout_var;
  }
  else {
    sVar1 = value(other);
    RangeValue(&local_20);
    if (this->_isUnbound == false) {
      local_20._val = sVar1 + this->_val;
      local_20._isUnbound = false;
    }
    uVar2 = (undefined7)((ulong)extraout_RAX >> 8);
    local_30._isUnbound = local_20._isUnbound;
    local_30._val = local_20._val;
  }
  RVar3._1_7_ = uVar2;
  RVar3._isUnbound = local_30._isUnbound;
  RVar3._val = local_30._val;
  return RVar3;
}

Assistant:

RangeValue RangeValue::operator+ (const RangeValue& other) const {
    if (other.isUnbound())
        return RangeValue();
    else
        return (*this)+other.value();
}